

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,string_view federateName)

{
  bool bVar1;
  FederateState *pFVar2;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> BStack_48;
  const_iterator local_30;
  
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&BStack_48,&this->loopFederates,federateName);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_30,&(this->loopFederates).dataStorage);
  bVar1 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                    ((BlockIterator<helics::FedInfo,32,helics::FedInfo**> *)&BStack_48,&local_30);
  if (bVar1) {
    pFVar2 = (BStack_48.ptr)->fed;
  }
  else {
    pFVar2 = (FederateState *)0x0;
  }
  return pFVar2;
}

Assistant:

FederateState* CommonCore::getFederateCore(std::string_view federateName)
{
    auto fed = loopFederates.find(federateName);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}